

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  lyxp_expr *expr;
  char *pcVar6;
  char *pcVar7;
  uint local_2a4;
  char local_298 [8];
  char buf [512];
  uint8_t c;
  uint64_t unum;
  int64_t num;
  int count;
  int j;
  int i;
  char *end;
  char *cur_expr;
  char *module_name;
  lyxp_expr *exp;
  lys_type_bit **bits;
  uint16_t buf_len;
  void *data2_local;
  void *data1_local;
  char **value_local;
  int type_local;
  ly_ctx *ctx_local;
  
  switch(type) {
  case 2:
    iVar4 = *data2;
    local_298[0] = '\0';
    for (count = 0; count < iVar4; count = count + 1) {
      if (*(long *)((long)data1 + (long)count * 8) != 0) {
        if (local_298[0] == '\0') {
          strcpy(local_298,(char *)**(undefined8 **)((long)data1 + (long)count * 8));
        }
        else {
          sVar5 = strlen(local_298);
          sprintf(local_298 + sVar5," %s",**(undefined8 **)((long)data1 + (long)count * 8));
        }
      }
    }
    break;
  default:
    return 0;
  case 4:
    lVar1 = *data1;
    buf[0x1ff] = *data2;
    if (lVar1 == 0) {
      sprintf(local_298,"0.0");
    }
    else {
      num._4_4_ = sprintf(local_298,"%ld ",lVar1);
      if (((0 < lVar1) && (num._4_4_ + -1 <= (int)(uint)(byte)buf[0x1ff])) ||
         (num._4_4_ + -2 <= (int)(uint)(byte)buf[0x1ff])) {
        if (lVar1 < 1) {
          local_2a4 = (byte)buf[0x1ff] + 2;
        }
        else {
          local_2a4 = (byte)buf[0x1ff] + 1;
        }
        num._4_4_ = sprintf(local_298,"%0*ld ",(ulong)local_2a4,lVar1);
      }
      bVar2 = true;
      for (count = (int)(byte)buf[0x1ff]; 0 < count; count = count + -1) {
        if (((bVar2) && (1 < count)) && (local_298[num._4_4_ + -2] == '0')) {
          local_298[num._4_4_ + -1] = '\0';
        }
        else {
          bVar2 = false;
          local_298[num._4_4_ + -1] = local_298[num._4_4_ + -2];
        }
        num._4_4_ = num._4_4_ + -1;
      }
      local_298[num._4_4_ + -1] = '.';
    }
    break;
  case 7:
    pcVar7 = strchr(*value,0x3a);
    if (pcVar7 == (char *)0x0) {
      sprintf(local_298,"%s:%s",data1,*value);
    }
    else {
      strcpy(local_298,*value);
    }
    break;
  case 8:
    expr = lyxp_parse_expr(ctx,*value);
    if (expr == (lyxp_expr *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,0x404);
      return 0;
    }
    cur_expr = (char *)0x0;
    num._4_4_ = 0;
    for (count = 0; (uint)count < (uint)expr->used; count = count + 1) {
      pcVar7 = expr->expr + expr->expr_pos[count];
      if ((count != 0) &&
         (pcVar6 = expr->expr +
                   (long)(int)(uint)expr->tok_len[count + -1] +
                   (long)(int)(uint)expr->expr_pos[count + -1], pcVar6 != pcVar7)) {
        if (0x1ff < (long)(pcVar7 + ((long)num._4_4_ - (long)pcVar6))) {
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                 ,0x40e);
          lyxp_expr_free(expr);
          return 0;
        }
        strncpy(local_298 + num._4_4_,pcVar6,(long)pcVar7 - (long)pcVar6);
        num._4_4_ = num._4_4_ + ((int)pcVar7 - (int)pcVar6);
      }
      if ((expr->tokens[count] == LYXP_TOKEN_NAMETEST) &&
         (pcVar6 = strnchr(pcVar7,0x3a,(uint)expr->tok_len[count]), pcVar6 != (char *)0x0)) {
        iVar4 = (int)(pcVar6 + 1) - (int)pcVar7;
        if ((cur_expr == (char *)0x0) || (iVar3 = strncmp(pcVar7,cur_expr,(long)iVar4), iVar3 != 0))
        {
          if (0x1ff < num._4_4_ + iVar4) {
            ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                   ,0x41e);
            lyxp_expr_free(expr);
            return 0;
          }
          strncpy(local_298 + num._4_4_,pcVar7,(long)iVar4);
          num._4_4_ = iVar4 + num._4_4_;
        }
        if (0x1ff < (int)(num._4_4_ + ((uint)expr->tok_len[count] - iVar4))) {
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                 ,0x429);
          lyxp_expr_free(expr);
          return 0;
        }
        strncpy(local_298 + num._4_4_,pcVar6 + 1,(long)(int)((uint)expr->tok_len[count] - iVar4));
        num._4_4_ = ((uint)expr->tok_len[count] - iVar4) + num._4_4_;
        cur_expr = pcVar7;
      }
      else {
        if (0x1ff < (int)(num._4_4_ + (uint)expr->tok_len[count])) {
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                 ,0x431);
          lyxp_expr_free(expr);
          return 0;
        }
        strncpy(local_298 + num._4_4_,expr->expr + expr->expr_pos[count],(ulong)expr->tok_len[count]
               );
        num._4_4_ = (uint)expr->tok_len[count] + num._4_4_;
      }
    }
    if (0x1ff < num._4_4_) {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,0x43a);
      lyxp_expr_free(expr);
      return 0;
    }
    local_298[num._4_4_] = '\0';
    lyxp_expr_free(expr);
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    sprintf(local_298,"%ld",*data1);
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    sprintf(local_298,"%lu",*data1);
  }
  iVar4 = strcmp(local_298,*value);
  if (iVar4 != 0) {
    lydict_remove(ctx,*value);
    pcVar7 = lydict_insert(ctx,local_298,0);
    *value = pcVar7;
  }
  ctx_local._4_4_ = (uint)(iVar4 != 0);
  return ctx_local._4_4_;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    const uint16_t buf_len = 511;
    char buf[buf_len + 1];
    struct lys_type_bit **bits = NULL;
    struct lyxp_expr *exp;
    const char *module_name, *cur_expr, *end;
    int i, j, count;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                sprintf(buf + strlen(buf), " %s", bits[i]->name);
            } else {
                strcpy(buf, bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_INST:
        exp = lyxp_parse_expr(ctx, *value);
        LY_CHECK_ERR_RETURN(!exp, LOGINT(ctx), 0);

        module_name = NULL;
        count = 0;
        for (i = 0; (unsigned)i < exp->used; ++i) {
            cur_expr = &exp->expr[exp->expr_pos[i]];

            /* copy WS */
            if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
                if (count + (cur_expr - end) > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], end, cur_expr - end);
                count += cur_expr - end;
            }

            if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
                /* get the module name with ":" */
                ++end;
                j = end - cur_expr;

                if (!module_name || strncmp(cur_expr, module_name, j)) {
                    /* print module name with colon, it does not equal to the parent one */
                    if (count + j > buf_len) {
                        LOGINT(ctx);
                        lyxp_expr_free(exp);
                        return 0;
                    }
                    strncpy(&buf[count], cur_expr, j);
                    count += j;
                }
                module_name = cur_expr;

                /* copy the rest */
                if (count + (exp->tok_len[i] - j) > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], end, exp->tok_len[i] - j);
                count += exp->tok_len[i] - j;
            } else {
                if (count + exp->tok_len[i] > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                count += exp->tok_len[i];
            }
        }
        if (count > buf_len) {
            LOGINT(ctx);
            lyxp_expr_free(exp);
            return 0;
        }
        buf[count] = '\0';

        lyxp_expr_free(exp);
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ( (num > 0 && (count - 1) <= c)
                 || (count - 2) <= c ) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value)
                 * for (num<0) - extra character for '-' sign */
                count = sprintf(buf, "%0*"PRId64" ", (num > 0) ? (c + 1) : (c + 2), num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        return 0;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        return 1;
    }

    return 0;
}